

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O1

void __thiscall
bgui::ImageAdapter<unsigned_char>::getPixel
          (ImageAdapter<unsigned_char> *this,double *r,double *g,double *b,float x,float y,int ir,
          int ig,int ib)

{
  double dVar1;
  pointer pIVar2;
  uchar ***pppuVar3;
  uint uVar4;
  work_t wVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  uint uVar10;
  int iVar11;
  float fVar12;
  double dVar13;
  double dVar14;
  float fVar15;
  
  if ((this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->mipmap).
      super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = (long)x;
    lVar8 = (long)y;
    pppuVar3 = this->image->img;
    *r = (double)pppuVar3[ir][lVar8][lVar7];
    *g = (double)pppuVar3[ig][lVar8][lVar7];
    dVar13 = (double)pppuVar3[ib][lVar8][lVar7];
  }
  else {
    dVar13 = log(1.0 / (this->super_ImageAdapterBase).scale);
    uVar4 = (int)(dVar13 / 0.6931471805599453) - 1;
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar10 = (int)((ulong)((long)(this->mipmap).
                                 super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 3) *
             -0x49249249 - 1;
    if ((int)uVar4 < (int)uVar10) {
      uVar10 = uVar4;
    }
    iVar9 = uVar10 + 1;
    iVar11 = 1 << ((byte)iVar9 & 0x1f);
    if ((int)uVar10 < 0) {
      wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (this->image,x,y,ir);
      *r = (double)wVar5;
      wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (this->image,x,y,ig);
      *g = (double)wVar5;
      this_00 = this->image;
      fVar15 = y;
      fVar12 = x;
    }
    else {
      fVar15 = (float)iVar11;
      fVar12 = x / fVar15;
      fVar15 = y / fVar15;
      wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        (pIVar2 + uVar10,fVar12,fVar15,ir);
      *r = (double)wVar5;
      wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                        ((this->mipmap).
                         super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar10,fVar12,fVar15,ig);
      *g = (double)wVar5;
      this_00 = (this->mipmap).
                super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar10;
    }
    wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                      (this_00,fVar12,fVar15,ib);
    *b = (double)wVar5;
    if ((int)uVar10 < -1) {
      return;
    }
    pIVar2 = (this->mipmap).
             super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = (int)((ulong)((long)(this->mipmap).
                                super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) >> 3);
    if (SBORROW4(iVar9,iVar6 * -0x49249249) == iVar9 + iVar6 * 0x49249249 < 0) {
      return;
    }
    dVar13 = (double)iVar11;
    dVar13 = (1.0 / (this->super_ImageAdapterBase).scale - dVar13) / dVar13;
    if (dVar13 <= 1e-06) {
      return;
    }
    dVar14 = 1.0 - dVar13;
    fVar12 = (float)(2 << ((byte)iVar9 & 0x1f));
    fVar15 = x / fVar12;
    fVar12 = y / fVar12;
    dVar1 = *r;
    wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                      (pIVar2 + iVar9,fVar15,fVar12,ir);
    *r = (double)wVar5 * dVar13 + dVar1 * dVar14;
    dVar1 = *g;
    wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                      ((this->mipmap).
                       super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar9,fVar15,fVar12,ig);
    *g = (double)wVar5 * dVar13 + dVar1 * dVar14;
    dVar1 = *b;
    wVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getBilinear
                      ((this->mipmap).
                       super__Vector_base<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar9,fVar15,fVar12,ib);
    dVar13 = (double)wVar5 * dVar13 + dVar14 * dVar1;
  }
  *b = dVar13;
  return;
}

Assistant:

void getPixel(double &r, double &g, double &b, float x, float y,
                  int ir, int ig, int ib) const
    {
      if (mipmap.size() > 0)
      {
        int j=static_cast<int>(log(1/scale)/log(2))-1;
        j=std::min(static_cast<int>(mipmap.size())-1, j);

        int ds=1<<(j+1);

        if (j < 0)
        {
          r=image->getBilinear(x, y, ir);
          g=image->getBilinear(x, y, ig);
          b=image->getBilinear(x, y, ib);
        }
        else
        {
          r=mipmap[j].getBilinear(x/ds, y/ds, ir);
          g=mipmap[j].getBilinear(x/ds, y/ds, ig);
          b=mipmap[j].getBilinear(x/ds, y/ds, ib);
        }

        if (j+1 >= 0 && j+1 < static_cast<int>(mipmap.size()))
        {
          double f=(1/scale-ds)/ds;

          if (f > 1e-6)
          {
            r=(1-f)*r+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ir);
            g=(1-f)*g+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ig);
            b=(1-f)*b+f*mipmap[j+1].getBilinear(x/(2*ds), y/(2*ds), ib);
          }
        }

        return;
      }

      r=image->get(static_cast<long>(x), static_cast<long>(y), ir);
      g=image->get(static_cast<long>(x), static_cast<long>(y), ig);
      b=image->get(static_cast<long>(x), static_cast<long>(y), ib);
    }